

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldLiteGenerator::GenerateFieldInfo
          (RepeatedImmutableMessageFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  int iVar1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *output_local;
  Printer *printer_local;
  RepeatedImmutableMessageFieldLiteGenerator *this_local;
  
  iVar1 = FieldDescriptor::number(this->descriptor_);
  WriteIntToUtf16CharSequence(iVar1,output);
  iVar1 = GetExperimentalJavaFieldType(this->descriptor_);
  WriteIntToUtf16CharSequence(iVar1,output);
  io::Printer::Print(printer,&this->variables_,"\"$name$_\",\n$type$.class,\n");
  return;
}

Assistant:

void RepeatedImmutableMessageFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  printer->Print(variables_,
                 "\"$name$_\",\n"
                 "$type$.class,\n");
}